

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_sampling.cpp
# Opt level: O3

bool dxil_spv::emit_texture_gather_instruction
               (bool compare,bool raw,Impl *impl,CallInst *instruction)

{
  uint32_t image_ops;
  bool bVar1;
  bool bVar2;
  ComponentType CVar3;
  Id IVar4;
  Id IVar5;
  Id IVar6;
  ValueKind VVar7;
  Id type_id;
  uint uVar8;
  Builder *this;
  Value *pVVar9;
  mapped_type *pmVar10;
  Type *pTVar11;
  Operation *pOVar12;
  mapped_type *this_00;
  Operation *pOVar13;
  Op OVar14;
  ulong uVar15;
  uint uVar16;
  Op op;
  ulong uVar17;
  uint i;
  long lVar18;
  bool bVar19;
  uint32_t image_flags;
  Id components [2];
  uint32_t num_coords;
  uint32_t num_coords_full;
  Id offsets [2];
  Id components64 [4];
  Id image_id;
  Id coords [4];
  undefined1 in_stack_ffffffffffffff48;
  uint32_t local_94;
  mapped_type *local_90;
  Value local_88;
  Id local_70 [2];
  Vector<spv::Id> local_68;
  Id local_4c;
  Id local_48 [6];
  
  bVar1 = Converter::Impl::composite_is_accessed(impl,(Value *)instruction);
  bVar2 = true;
  if (bVar1) {
    this = Converter::Impl::builder(impl);
    pVVar9 = LLVMBC::Instruction::getOperand(&instruction->super_Instruction,1);
    IVar4 = Converter::Impl::get_id_for_value(impl,pVVar9,0);
    local_4c = IVar4;
    pVVar9 = LLVMBC::Instruction::getOperand(&instruction->super_Instruction,2);
    IVar5 = Converter::Impl::get_id_for_value(impl,pVVar9,0);
    IVar4 = Converter::Impl::build_sampled_image(impl,IVar4,IVar5,false);
    local_90 = std::__detail::
               _Map_base<unsigned_int,_std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta>,_dxil_spv::ThreadLocalAllocator<std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta>,_dxil_spv::ThreadLocalAllocator<std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                             *)&impl->handle_to_resource_meta,&local_4c);
    local_88.tween_id._4_4_ = 0;
    local_88.tween_id._0_4_ = 0;
    bVar2 = get_image_dimensions
                      (impl,local_4c,(uint32_t *)((long)&local_88.tween_id + 4),
                       (uint32_t *)&local_88.tween_id);
    uVar16 = local_88.tween_id._4_4_;
    if (bVar2) {
      local_48[0] = 0;
      local_48[1] = 0;
      local_48[2] = 0;
      local_48[3] = 0;
      local_70[0] = 0;
      local_70[1] = 0;
      local_94 = 0;
      uVar15 = (ulong)local_88.tween_id._4_4_;
      if (uVar15 != 0) {
        uVar17 = 0;
        do {
          pVVar9 = LLVMBC::Instruction::getOperand(&instruction->super_Instruction,(int)uVar17 + 3);
          IVar5 = Converter::Impl::get_id_for_value(impl,pVVar9,0);
          local_48[uVar17] = IVar5;
          uVar17 = uVar17 + 1;
        } while (uVar15 != uVar17);
      }
      IVar5 = spv::Builder::makeFloatType(this,0x20);
      IVar5 = Converter::Impl::build_vector(impl,IVar5,local_48,uVar16);
      local_88._12_4_ = (uint)local_88.tween_id;
      if ((uint)local_88.tween_id == 2) {
        get_texel_offsets(impl,instruction,&local_94,7,2,local_70,(bool)in_stack_ffffffffffffff48);
      }
      if (raw) {
        IVar6 = spv::Builder::makeIntegerType(this,0x20,false);
        VVar7 = spv::Builder::makeIntConstant(this,IVar6,0,false);
      }
      else {
        if (compare) {
          uVar16 = 10;
        }
        else {
          uVar16 = 9;
        }
        pVVar9 = LLVMBC::Instruction::getOperand(&instruction->super_Instruction,uVar16);
        VVar7 = Converter::Impl::get_id_for_value(impl,pVVar9,0);
      }
      local_68.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)instruction;
      pmVar10 = std::__detail::
                _Map_base<const_LLVMBC::Value_*,_std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::CompositeMeta>,_dxil_spv::ThreadLocalAllocator<std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::CompositeMeta>_>,_std::__detail::_Select1st,_std::equal_to<const_LLVMBC::Value_*>,_std::hash<const_LLVMBC::Value_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                ::operator[]((_Map_base<const_LLVMBC::Value_*,_std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::CompositeMeta>,_dxil_spv::ThreadLocalAllocator<std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::CompositeMeta>_>,_std::__detail::_Select1st,_std::equal_to<const_LLVMBC::Value_*>,_std::hash<const_LLVMBC::Value_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                              *)&impl->llvm_composite_meta,(key_type *)&local_68);
      uVar16 = pmVar10->access_mask;
      if ((uVar16 & 0x10) != 0) {
        local_68.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
        _M_impl.super__Vector_impl_data._M_start =
             (pointer)CONCAT44(local_68.
                               super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>
                               ._M_impl.super__Vector_impl_data._M_start._4_4_,0x29);
        std::
        _Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,dxil_spv::ThreadLocalAllocator<spv::Capability>>
        ::_M_insert_unique<spv::Capability_const&>
                  ((_Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,dxil_spv::ThreadLocalAllocator<spv::Capability>>
                    *)&this->capabilities,(Capability *)&local_68);
      }
      CVar3 = Converter::Impl::get_effective_typed_resource_type(local_90->component_type);
      type_id = Converter::Impl::get_type_id(impl,CVar3,1,4,false);
      IVar6 = type_id;
      if ((uVar16 & 0x10) != 0) {
        IVar6 = spv::Builder::makeIntegerType(this,0x20,false);
        local_68.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
        _M_impl.super__Vector_impl_data._M_start = (pointer)allocate_in_thread(8);
        local_68.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
        _M_impl.super__Vector_impl_data._M_finish =
             &(((CallInst *)
               local_68.
               super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_start)->super_Instruction).super_Value.kind;
        *(Id *)&(((CallInst *)
                 local_68.
                 super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
                 _M_impl.super__Vector_impl_data._M_start)->super_Instruction).super_Value.type =
             IVar6;
        *(Id *)((long)&(((CallInst *)
                        local_68.
                        super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>
                        ._M_impl.super__Vector_impl_data._M_start)->super_Instruction).super_Value.
                       type + 4) = type_id;
        local_68.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage =
             local_68.
             super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl
             .super__Vector_impl_data._M_finish;
        IVar6 = Converter::Impl::get_struct_type(impl,&local_68,0,"SparseTexel");
        if ((CallInst *)
            local_68.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>
            ._M_impl.super__Vector_impl_data._M_start != (CallInst *)0x0) {
          free_in_thread(local_68.
                         super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>
                         ._M_impl.super__Vector_impl_data._M_start);
        }
      }
      if (raw) {
        pTVar11 = LLVMBC::Value::getType((Value *)instruction);
        pTVar11 = LLVMBC::Type::getStructElementType(pTVar11,0);
        uVar8 = LLVMBC::Type::getIntegerBitWidth(pTVar11);
        bVar1 = uVar8 == 0x40;
      }
      else {
        bVar1 = false;
      }
      bVar19 = (uVar16 & 0x10) == 0;
      OVar14 = OpImageSparseDrefGather;
      if (bVar19) {
        OVar14 = OpImageDrefGather;
      }
      op = OpImageSparseGather;
      if (bVar19) {
        op = OpImageGather;
      }
      if (compare) {
        op = OVar14;
      }
      pOVar12 = Converter::Impl::allocate(impl,op,(Value *)instruction,IVar6);
      if ((uVar16 & 0x10) == 0) {
        pTVar11 = LLVMBC::Value::getType((Value *)instruction);
        pTVar11 = LLVMBC::Type::getStructElementType(pTVar11,0);
        Converter::Impl::decorate_relaxed_precision(impl,pTVar11,pOVar12->id,true);
      }
      local_68.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x3;
      local_88.type._0_4_ = IVar4;
      local_88.type._4_4_ = IVar5;
      local_88.kind = VVar7;
      local_68.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)&local_88;
      Operation::add_ids(pOVar12,(initializer_list<unsigned_int> *)&local_68);
      image_ops = local_94;
      if (local_94 == 0) {
        IVar6 = 0;
      }
      else {
        Operation::add_literal(pOVar12,local_94);
        IVar6 = build_texel_offset_vector(impl,local_70,local_88._12_4_,image_ops,true);
        Operation::add_id(pOVar12,IVar6);
      }
      Converter::Impl::add(impl,pOVar12,false);
      if (bVar1) {
        this_00 = (mapped_type *)Converter::Impl::allocate(impl,OpImageGather,type_id);
        local_88.type._0_4_ = IVar4;
        local_88.type._4_4_ = IVar5;
        IVar4 = spv::Builder::makeIntegerType(this,0x20,false);
        local_88.kind = spv::Builder::makeIntConstant(this,IVar4,1,false);
        local_68.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
        _M_impl.super__Vector_impl_data._M_finish = (pointer)0x3;
        local_68.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
        _M_impl.super__Vector_impl_data._M_start = (pointer)&local_88;
        Operation::add_ids((Operation *)this_00,(initializer_list<unsigned_int> *)&local_68);
        if (image_ops != 0) {
          Operation::add_literal((Operation *)this_00,image_ops);
          Operation::add_id((Operation *)this_00,IVar6);
        }
        Converter::Impl::add(impl,(Operation *)this_00,false);
        if ((uVar16 & 0x10) == 0) {
          IVar4 = pOVar12->id;
        }
        else {
          pOVar13 = Converter::Impl::allocate(impl,OpCompositeExtract,type_id);
          IVar4 = pOVar13->id;
          Operation::add_id(pOVar13,pOVar12->id);
          Operation::add_literal(pOVar13,1);
          Converter::Impl::add(impl,pOVar13,false);
        }
        lVar18 = 0;
        local_90 = this_00;
        do {
          IVar5 = spv::Builder::makeIntegerType(this,0x20,false);
          pOVar12 = Converter::Impl::allocate(impl,OpCompositeExtract,IVar5);
          IVar5 = spv::Builder::makeIntegerType(this,0x20,false);
          pOVar13 = Converter::Impl::allocate(impl,OpCompositeExtract,IVar5);
          Operation::add_id(pOVar12,IVar4);
          Operation::add_literal(pOVar12,(uint32_t)lVar18);
          Operation::add_id(pOVar13,local_90->raw_component_vecsize);
          Operation::add_literal(pOVar13,(uint32_t)lVar18);
          Converter::Impl::add(impl,pOVar12,false);
          Converter::Impl::add(impl,pOVar13,false);
          local_88.type._0_4_ = pOVar12->id;
          local_88.type._4_4_ = pOVar13->id;
          IVar5 = spv::Builder::makeIntegerType(this,0x20,false);
          IVar5 = Converter::Impl::build_vector(impl,IVar5,(Id *)&local_88,2);
          IVar6 = spv::Builder::makeIntegerType(this,0x40,false);
          pOVar12 = Converter::Impl::allocate(impl,OpBitcast,IVar6);
          Operation::add_id(pOVar12,IVar5);
          *(Id *)((long)&local_68.
                         super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>
                         ._M_impl.super__Vector_impl_data._M_start + lVar18 * 4) = pOVar12->id;
          Converter::Impl::add(impl,pOVar12,false);
          lVar18 = lVar18 + 1;
        } while (lVar18 != 4);
        IVar4 = spv::Builder::makeIntegerType(this,0x40,false);
        IVar4 = Converter::Impl::build_vector(impl,IVar4,(Id *)&local_68,4);
        if ((uVar16 & 0x10) == 0) {
          Converter::Impl::rewrite_value(impl,(Value *)instruction,IVar4);
          return bVar2;
        }
        pTVar11 = LLVMBC::Value::getType((Value *)instruction);
        pTVar11 = LLVMBC::Type::getStructElementType(pTVar11,0);
        CVar3 = U64;
      }
      else {
        pTVar11 = LLVMBC::Value::getType((Value *)instruction);
        pTVar11 = LLVMBC::Type::getStructElementType(pTVar11,0);
        CVar3 = local_90->component_type;
        if ((uVar16 & 0x10) == 0) {
          Converter::Impl::fixup_load_type_typed(impl,CVar3,4,(Value *)instruction,pTVar11);
          build_exploded_composite_from_vector(impl,&instruction->super_Instruction,4);
          return bVar2;
        }
        IVar4 = 0;
      }
      Converter::Impl::repack_sparse_feedback(impl,CVar3,4,(Value *)instruction,pTVar11,IVar4);
    }
  }
  return bVar2;
}

Assistant:

bool emit_texture_gather_instruction(bool compare, bool raw, Converter::Impl &impl, const llvm::CallInst *instruction)
{
	// Elide dead loads.
	if (!impl.composite_is_accessed(instruction))
		return true;

	auto &builder = impl.builder();

	spv::Id image_id = impl.get_id_for_value(instruction->getOperand(1));
	spv::Id sampler_id = impl.get_id_for_value(instruction->getOperand(2));
	spv::Id combined_image_sampler_id = impl.build_sampled_image(image_id, sampler_id, false);
	const auto &meta = impl.handle_to_resource_meta[image_id];

	uint32_t num_coords_full = 0, num_coords = 0;
	if (!get_image_dimensions(impl, image_id, &num_coords_full, &num_coords))
		return false;

	spv::Id coords[4] = {};
	spv::Id offsets[2] = {};
	uint32_t image_flags = 0;

	for (unsigned i = 0; i < num_coords_full; i++)
		coords[i] = impl.get_id_for_value(instruction->getOperand(3 + i));
	spv::Id coord_id = impl.build_vector(builder.makeFloatType(32), coords, num_coords_full);

	if (num_coords == 2 && !get_texel_offsets(impl, instruction, image_flags, 7, num_coords, offsets, true))
		return false;

	spv::Id aux_id;

	if (!raw)
	{
		if (compare)
		{
			// TextureGatherCmp has a component here. Perhaps it is to select depth vs stencil?
			aux_id = impl.get_id_for_value(instruction->getOperand(10));
		}
		else
			aux_id = impl.get_id_for_value(instruction->getOperand(9));
	}
	else
		aux_id = builder.makeUintConstant(0);

	auto &access_meta = impl.llvm_composite_meta[instruction];
	bool sparse = (access_meta.access_mask & (1u << 4)) != 0;
	if (sparse)
		builder.addCapability(spv::CapabilitySparseResidency);

	auto effective_component_type = Converter::Impl::get_effective_typed_resource_type(meta.component_type);
	spv::Id texel_type = impl.get_type_id(effective_component_type, 1, 4);
	spv::Id sample_type;

	if (sparse)
		sample_type = impl.get_struct_type({ builder.makeUintType(32), texel_type }, 0, "SparseTexel");
	else
		sample_type = texel_type;

	bool raw_gather64 = raw && instruction->getType()->getStructElementType(0)->getIntegerBitWidth() == 64;

	spv::Op opcode;
	if (compare)
		opcode = sparse ? spv::OpImageSparseDrefGather : spv::OpImageDrefGather;
	else
		opcode = sparse ? spv::OpImageSparseGather : spv::OpImageGather;

	Operation *op = impl.allocate(opcode, instruction, sample_type);
	if (!sparse)
		impl.decorate_relaxed_precision(instruction->getType()->getStructElementType(0), op->id, true);

	op->add_ids({ combined_image_sampler_id, coord_id, aux_id });

	spv::Id texel_offset_id = 0;
	if (image_flags)
	{
		op->add_literal(image_flags);
		texel_offset_id = build_texel_offset_vector(impl, offsets, num_coords, image_flags, true);
		op->add_id(texel_offset_id);
	}

	impl.add(op);

	if (raw_gather64)
	{
		Operation *op_green = impl.allocate(spv::OpImageGather, texel_type);
		op_green->add_ids({ combined_image_sampler_id, coord_id, builder.makeUintConstant(1) });

		if (image_flags)
		{
			op_green->add_literal(image_flags);
			op_green->add_id(texel_offset_id);
		}

		impl.add(op_green);

		spv::Id components64[4];
		spv::Id gather_result;

		if (sparse)
		{
			auto *extract_value = impl.allocate(spv::OpCompositeExtract, texel_type);
			gather_result = extract_value->id;
			extract_value->add_id(op->id);
			extract_value->add_literal(1);
			impl.add(extract_value);
		}
		else
			gather_result = op->id;

		for (unsigned i = 0; i < 4; i++)
		{
			auto *extr0 = impl.allocate(spv::OpCompositeExtract, builder.makeUintType(32));
			auto *extr1 = impl.allocate(spv::OpCompositeExtract, builder.makeUintType(32));

			extr0->add_id(gather_result);
			extr0->add_literal(i);
			extr1->add_id(op_green->id);
			extr1->add_literal(i);

			impl.add(extr0);
			impl.add(extr1);

			spv::Id components[2] = { extr0->id, extr1->id };
			spv::Id value = impl.build_vector(builder.makeUintType(32), components, 2);
			auto *bitcast_64 = impl.allocate(spv::OpBitcast, builder.makeUintType(64));
			bitcast_64->add_id(value);
			components64[i] = bitcast_64->id;

			impl.add(bitcast_64);
		}

		spv::Id u64_vector = impl.build_vector(builder.makeUintType(64), components64, 4);

		if (sparse)
		{
			auto *target_type = instruction->getType()->getStructElementType(0);
			impl.repack_sparse_feedback(DXIL::ComponentType::U64, 4, instruction, target_type, u64_vector);
		}
		else
		{
			impl.rewrite_value(instruction, u64_vector);
		}
	}
	else
	{
		auto *target_type = instruction->getType()->getStructElementType(0);

		if (sparse)
			impl.repack_sparse_feedback(meta.component_type, 4, instruction, target_type);
		else
		{
			impl.fixup_load_type_typed(meta.component_type, 4, instruction, target_type);
			build_exploded_composite_from_vector(impl, instruction, 4);
		}
	}

	return true;
}